

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

QPDF_BOOL qpdf_oh_is_name_and_equals(qpdf_data qpdf,qpdf_oh oh,char *name)

{
  int iVar1;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  function<int_()> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = return_false;
  local_28._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_28.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1077:58)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1077:58)>
             ::_M_manager;
  local_48._M_unused._0_8_ = (undefined8)name;
  iVar1 = do_with_oh<int>(qpdf,oh,&local_28,(function<int_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_is_name_and_equals(qpdf_data qpdf, qpdf_oh oh, char const* name)
{
    return do_with_oh<QPDF_BOOL>(qpdf, oh, return_false, [name](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_is_name_and_equals");
        return o.isNameAndEquals(name);
    });
}